

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O3

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>
slang::ast::AttributeSymbol::fromSyntax
          (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax,
          Scope *scope,LookupLocation lookupLocation)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this;
  pointer ppAVar1;
  char *pcVar2;
  AttributeInstanceSyntax *pAVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar4;
  uint uVar5;
  Compilation **ppCVar6;
  size_t sVar7;
  char *pcVar8;
  value_type *pvVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  TypedBumpAllocator<slang::ConstantValue> *this_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar13;
  ConstantValue *args_2;
  uint64_t uVar14;
  ulong uVar15;
  Diagnostic *this_01;
  undefined4 extraout_var;
  Scope *extraout_RDX;
  long lVar17;
  Scope *extraout_RDX_00;
  Scope *extraout_RDX_01;
  size_t extraout_RDX_02;
  size_type __rlen_1;
  Scope *pSVar18;
  __extent_storage<18446744073709551615UL> _Var19;
  size_type __rlen;
  ulong uVar20;
  pointer ppAVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  string_view sVar41;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar42;
  try_emplace_args_t local_239;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_238;
  uint local_230;
  undefined2 local_22c;
  string_view name;
  AttributeSymbol *attr;
  uint64_t local_210;
  size_t pos;
  Scope *local_200;
  Compilation *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  value_type *elements;
  Scope *local_1d8;
  ulong local_1d0;
  size_t pos_1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  char cStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  char cStack_1b9;
  locator res;
  SmallVector<const_slang::ast::AttributeSymbol_*,_5UL> attrs;
  LookupLocation lookupLocation_local;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  nameMap;
  pointer ppAVar16;
  
  lookupLocation_local.scope = lookupLocation.scope;
  ppAVar21 = syntax._M_ptr;
  lookupLocation_local.index = lookupLocation.index;
  if (syntax._M_extent._M_extent_value._M_extent_value == 0) {
    _Var19._M_extent_value = 0;
    ppAVar16 = (pointer)0x0;
  }
  else {
    nameMap.super_Storage.ptr = (char *)&nameMap;
    nameMap._112_8_ = 0x3f;
    nameMap._120_8_ = 1;
    nameMap._128_16_ = ZEXT816(0x4619b0);
    nameMap._144_16_ = (undefined1  [16])0x0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len = 0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.cap = 5;
    local_1f8 = scope->compilation;
    ppAVar1 = ppAVar21 + syntax._M_extent._M_extent_value._M_extent_value;
    this_00 = &local_1f8->constantAllocator;
    local_1d8 = scope;
    nameMap.super_Storage._104_8_ = nameMap.super_Storage.ptr;
    do {
      pAVar3 = *ppAVar21;
      local_1d0 = (pAVar3->specs).elements._M_extent._M_extent_value + 1;
      if (1 < local_1d0) {
        local_1d0 = local_1d0 >> 1;
        uVar22 = 0;
        do {
          ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )((pAVar3->specs).elements._M_ptr + uVar22 * 2));
          pSVar4 = *ppSVar13;
          this = pSVar4 + 1;
          sVar41 = parsing::Token::valueText((Token *)this);
          scope = (Scope *)sVar41._M_str;
          name = sVar41;
          if (sVar41._M_len != 0) {
            if (pSVar4[1].previewNode == (SyntaxNode *)0x0) {
              local_230 = 1;
              local_22c = 0;
              local_238.val = 1;
              SVInt::clearUnusedBits((SVInt *)&local_238);
              auVar23 = (undefined1  [16])res._0_16_;
              res.n = local_230;
              res._14_2_ = auVar23._14_2_;
              res._12_2_ = local_22c;
              res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)local_238.val;
              local_238 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                          parsing::Token::location((Token *)this);
              args_2 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                                 (this_00,(ConstantValue *)&res);
              attr = BumpAllocator::
                     emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ConstantValue&>
                               (&local_1f8->super_BumpAllocator,&name,(SourceLocation *)&local_238,
                                args_2);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&res);
            }
            else {
              local_238 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                          parsing::Token::location((Token *)this);
              res._0_16_ = sVar41;
              attr = BumpAllocator::
                     emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Scope_const&,slang::ast::LookupLocation&,slang::syntax::ExpressionSyntax&>
                               (&local_1f8->super_BumpAllocator,
                                (basic_string_view<char,_std::char_traits<char>_> *)&res,
                                (SourceLocation *)&local_238,local_1d8,&lookupLocation_local,
                                (ExpressionSyntax *)pSVar4[1].previewNode[1].previewNode);
            }
            (attr->super_Symbol).originatingSyntax = pSVar4;
            uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&nameMap.super_Storage.field_0x68,&name);
            uVar20 = uVar14 >> (nameMap._112_1_ & 0x3f);
            lVar17 = (uVar14 & 0xff) * 4;
            cVar25 = (&UNK_00461acc)[lVar17];
            cVar26 = (&UNK_00461acd)[lVar17];
            cVar27 = (&UNK_00461ace)[lVar17];
            cVar28 = (&UNK_00461acf)[lVar17];
            elements = (value_type *)nameMap._136_8_;
            sVar7 = name._M_len;
            pcVar8 = name._M_str;
            local_1f0 = (ulong)((uint)uVar14 & 7);
            local_200 = (Scope *)nameMap._120_8_;
            pSVar18 = (Scope *)0x0;
            local_210 = nameMap._128_8_;
            cVar29 = cVar25;
            cVar30 = cVar26;
            cVar31 = cVar27;
            cVar32 = cVar28;
            cVar33 = cVar25;
            cVar34 = cVar26;
            cVar35 = cVar27;
            cVar36 = cVar28;
            cVar37 = cVar25;
            cVar38 = cVar26;
            cVar39 = cVar27;
            cVar40 = cVar28;
            do {
              pvVar9 = elements;
              pcVar2 = (char *)(local_210 + uVar20 * 0x10);
              auVar23[0] = -(*pcVar2 == cVar25);
              auVar23[1] = -(pcVar2[1] == cVar26);
              auVar23[2] = -(pcVar2[2] == cVar27);
              auVar23[3] = -(pcVar2[3] == cVar28);
              auVar23[4] = -(pcVar2[4] == cVar29);
              auVar23[5] = -(pcVar2[5] == cVar30);
              auVar23[6] = -(pcVar2[6] == cVar31);
              auVar23[7] = -(pcVar2[7] == cVar32);
              auVar23[8] = -(pcVar2[8] == cVar33);
              auVar23[9] = -(pcVar2[9] == cVar34);
              auVar23[10] = -(pcVar2[10] == cVar35);
              auVar23[0xb] = -(pcVar2[0xb] == cVar36);
              auVar23[0xc] = -(pcVar2[0xc] == cVar37);
              auVar23[0xd] = -(pcVar2[0xd] == cVar38);
              auVar23[0xe] = -(pcVar2[0xe] == cVar39);
              auVar23[0xf] = -(pcVar2[0xf] == cVar40);
              local_1e8 = CONCAT71(local_1e8._1_7_,pcVar2[0xf]);
              uVar11 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
              pos = uVar20;
              if (uVar11 != 0) {
                pos_1 = CONCAT17(cVar32,CONCAT16(cVar31,CONCAT15(cVar30,CONCAT14(cVar29,CONCAT13(
                                                  cVar28,CONCAT12(cVar27,CONCAT11(cVar26,cVar25)))))
                                                ));
                cStack_1c0 = cVar33;
                cStack_1bf = cVar34;
                cStack_1be = cVar35;
                cStack_1bd = cVar36;
                cStack_1bc = cVar37;
                cStack_1bb = cVar38;
                cStack_1ba = cVar39;
                cStack_1b9 = cVar40;
                do {
                  uVar5 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                    }
                  }
                  uVar15 = (ulong)uVar5;
                  if (sVar7 == pvVar9[uVar20 * 0xf + uVar15].first._M_len) {
                    if (sVar7 != 0) {
                      iVar12 = bcmp(pcVar8,pvVar9[uVar20 * 0xf + uVar15].first._M_str,sVar7);
                      cVar25 = (char)pos_1;
                      cVar26 = pos_1._1_1_;
                      cVar27 = pos_1._2_1_;
                      cVar28 = pos_1._3_1_;
                      cVar29 = pos_1._4_1_;
                      cVar30 = pos_1._5_1_;
                      cVar31 = pos_1._6_1_;
                      cVar32 = pos_1._7_1_;
                      cVar33 = cStack_1c0;
                      cVar34 = cStack_1bf;
                      cVar35 = cStack_1be;
                      cVar36 = cStack_1bd;
                      cVar37 = cStack_1bc;
                      cVar38 = cStack_1bb;
                      cVar39 = cStack_1ba;
                      cVar40 = cStack_1b9;
                      if (iVar12 != 0) goto LAB_003a11ef;
                    }
                    this_01 = Scope::addDiag(local_1d8,(DiagCode)0xed0006,
                                             (attr->super_Symbol).location);
                    Diagnostic::operator<<(this_01,name);
                    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_
                    [pvVar9[uVar20 * 0xf + uVar15].second] = attr;
                    scope = (Scope *)attrs.
                                     super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.
                                     data_;
                    goto LAB_003a0fda;
                  }
LAB_003a11ef:
                  uVar11 = uVar11 - 1 & uVar11;
                } while (uVar11 != 0);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[local_1f0] & (byte)local_1e8) == 0)
              break;
              ppCVar6 = &pSVar18->compilation;
              pSVar18 = (Scope *)((long)&pSVar18->compilation + 1);
              uVar20 = (long)ppCVar6 + pos + 1 & (ulong)local_200;
            } while (pSVar18 <= local_200);
            SmallVectorBase<slang::ast::AttributeSymbol_const*>::
            emplace_back<slang::ast::AttributeSymbol_const*const&>
                      ((SmallVectorBase<slang::ast::AttributeSymbol_const*> *)&attrs,&attr);
            local_238.pVal =
                 (uint64_t *)
                 (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len - 1);
            local_210 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                        operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)&nameMap.super_Storage.field_0x68,&name);
            uVar10 = nameMap._120_8_;
            scope = (Scope *)(local_210 >> (nameMap._112_1_ & 0x3f));
            lVar17 = (local_210 & 0xff) * 4;
            cVar25 = (&UNK_00461acc)[lVar17];
            cVar26 = (&UNK_00461acd)[lVar17];
            cVar27 = (&UNK_00461ace)[lVar17];
            cVar28 = (&UNK_00461acf)[lVar17];
            local_1e8 = (ulong)((uint)local_210 & 7);
            pos = nameMap._136_8_;
            sVar7 = name._M_len;
            pcVar8 = name._M_str;
            uVar20 = 0;
            local_1f0 = nameMap._128_8_;
            local_200 = scope;
            do {
              pcVar2 = (char *)(local_1f0 + (long)scope * 0x10);
              auVar24[0] = -(*pcVar2 == cVar25);
              auVar24[1] = -(pcVar2[1] == cVar26);
              auVar24[2] = -(pcVar2[2] == cVar27);
              auVar24[3] = -(pcVar2[3] == cVar28);
              auVar24[4] = -(pcVar2[4] == cVar25);
              auVar24[5] = -(pcVar2[5] == cVar26);
              auVar24[6] = -(pcVar2[6] == cVar27);
              auVar24[7] = -(pcVar2[7] == cVar28);
              auVar24[8] = -(pcVar2[8] == cVar25);
              auVar24[9] = -(pcVar2[9] == cVar26);
              auVar24[10] = -(pcVar2[10] == cVar27);
              auVar24[0xb] = -(pcVar2[0xb] == cVar28);
              auVar24[0xc] = -(pcVar2[0xc] == cVar25);
              auVar24[0xd] = -(pcVar2[0xd] == cVar26);
              auVar24[0xe] = -(pcVar2[0xe] == cVar27);
              auVar24[0xf] = -(pcVar2[0xf] == cVar28);
              elements = (value_type *)CONCAT71(elements._1_7_,pcVar2[0xf]);
              uVar11 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
              pos_1 = (size_t)scope;
              if (uVar11 != 0) {
                lVar17 = pos + (long)scope * 0x168;
                do {
                  uVar5 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                    }
                  }
                  if ((sVar7 == *(size_t *)(lVar17 + (ulong)uVar5 * 0x18)) &&
                     ((sVar7 == 0 ||
                      (iVar12 = bcmp(pcVar8,*(void **)(lVar17 + 8 + (ulong)uVar5 * 0x18),sVar7),
                      scope = extraout_RDX, iVar12 == 0)))) goto LAB_003a0fda;
                  uVar11 = uVar11 - 1 & uVar11;
                } while (uVar11 != 0);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[local_1e8] & (byte)elements) == 0)
              break;
              lVar17 = pos_1 + uVar20;
              uVar20 = uVar20 + 1;
              scope = (Scope *)(lVar17 + 1U & uVar10);
            } while (uVar20 <= (ulong)uVar10);
            if ((ulong)nameMap._152_8_ < (ulong)nameMap._144_8_) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                        (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                               *)&nameMap.super_Storage.field_0x68,
                         (arrays_type *)&nameMap.field_0x70,(size_t)local_200,local_210,&local_239,
                         &name,&local_238.val);
              nameMap._152_8_ = nameMap._152_8_ + 1;
              scope = extraout_RDX_00;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                        (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                               *)&nameMap.super_Storage.field_0x68,local_210,&local_239,&name,
                         &local_238.val);
              scope = extraout_RDX_01;
            }
          }
LAB_003a0fda:
          uVar22 = uVar22 + 1;
        } while (uVar22 != local_1d0);
      }
      ppAVar21 = ppAVar21 + 1;
    } while (ppAVar21 != ppAVar1);
    iVar12 = SmallVectorBase<const_slang::ast::AttributeSymbol_*>::copy
                       (&attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>,
                        (EVP_PKEY_CTX *)local_1f8,(EVP_PKEY_CTX *)scope);
    ppAVar16 = (pointer)CONCAT44(extraout_var,iVar12);
    if (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ !=
        (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement) {
      operator_delete(attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_);
    }
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)nameMap.super_Storage._104_8_;
    _Var19._M_extent_value = extraout_RDX_02;
    if (nameMap._136_8_ != 0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
      ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
                    *)&attrs,
                   (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                    *)nameMap._136_8_,(nameMap._120_8_ * 0x178 + 0x186U) / 0x18);
    }
  }
  sVar42._M_extent._M_extent_value = _Var19._M_extent_value;
  sVar42._M_ptr = ppAVar16;
  return sVar42;
}

Assistant:

std::span<const AttributeSymbol* const> AttributeSymbol::fromSyntax(
    std::span<const AttributeInstanceSyntax* const> syntax, const Scope& scope,
    LookupLocation lookupLocation) {

    if (syntax.empty())
        return {};

    return createAttributes(
        syntax, scope,
        [&scope, &lookupLocation](auto& comp, auto name, auto loc, auto& exprSyntax) {
            return comp.template emplace<AttributeSymbol>(name, loc, scope, lookupLocation,
                                                          exprSyntax);
        });
}